

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_key_derivation_input_internal
          (psa_key_derivation_operation_t *operation,psa_key_derivation_step_t step,
          psa_key_type_t key_type,uint8_t *data,size_t data_length)

{
  psa_hmac_internal_data *hmac;
  uint uVar1;
  int iVar2;
  byte bVar3;
  uint8_t uVar4;
  psa_status_t pVar5;
  uint8_t *__dest;
  uint uVar6;
  psa_algorithm_t hash_alg;
  undefined6 in_register_00000032;
  uint8_t local_138;
  undefined1 local_137;
  undefined1 local_136 [262];
  
  uVar6 = operation->alg;
  uVar1 = uVar6 & 0x2003ffff;
  if ((uVar6 & 0x7f000000) != 0x30000000) {
    uVar1 = uVar6;
  }
  pVar5 = -0x87;
  iVar2 = (int)CONCAT62(in_register_00000032,step);
  if (iVar2 - 0x201U < 4) {
    if ((key_type != 0x1001) && (key_type != 0)) goto LAB_00111d3b;
  }
  else if ((iVar2 != 0x101) || ((key_type != 0 && (key_type != 0x1200)))) goto LAB_00111d3b;
  uVar6 = uVar1 & 0xffffff00;
  if (uVar6 == 0x20000300) {
    uVar6 = uVar1 & 0xff | 0x1000000;
    if (step != 0x101) goto LAB_00111d26;
    if (data_length < 0x81) {
      local_138 = '\0';
      local_137 = (undefined1)data_length;
      memset(local_136,0,data_length);
      local_136[data_length] = 0;
      local_136[data_length + 1] = local_137;
      memcpy(local_136 + data_length + 2,data,data_length);
      pVar5 = psa_tls12_prf_set_key
                        (&(operation->ctx).tls12_prf,uVar6,&local_138,
                         (size_t)(local_136 + (data_length * 2 - (long)&local_138) + 2));
      mbedtls_platform_zeroize(&local_138,0x104);
    }
  }
  else {
    if (uVar6 != 0x20000200) {
      if (uVar6 != 0x20000100) {
        return -0x89;
      }
      hash_alg = (uVar1 & 0xff) + 0x1000000;
      if (step == 0x101) {
        bVar3 = (operation->ctx).tls12_prf.output_block[0x2a];
        if ((bVar3 & 3) == 0) {
          pVar5 = psa_hmac_setup_internal(&(operation->ctx).hkdf.hmac,(uint8_t *)0x0,0,hash_alg);
          if (pVar5 != 0) goto LAB_00111d3b;
          bVar3 = ((operation->ctx).tls12_prf.output_block[0x2a] & 0xfc) + 1;
          (operation->ctx).tls12_prf.output_block[0x2a] = bVar3;
        }
        pVar5 = -0x89;
        if ((bVar3 & 3) == 1) {
          hmac = &(operation->ctx).hkdf.hmac;
          pVar5 = psa_hash_update(&hmac->hash_ctx,data,data_length);
          if ((pVar5 == 0) &&
             (pVar5 = psa_hmac_finish_internal(hmac,(operation->ctx).hkdf.prk,0x40), pVar5 == 0)) {
            bVar3 = (char)uVar1 - 1;
            if ((bVar3 < 0x12) && ((0x39f9fU >> (bVar3 & 0x1f) & 1) != 0)) {
              uVar4 = (&DAT_001384c8)[bVar3];
            }
            else {
              uVar4 = ((uVar1 & 0xff) == 0x13) << 6;
            }
            (operation->ctx).hkdf.offset_in_block = uVar4;
            (operation->ctx).hkdf.block_number = '\0';
            bVar3 = (operation->ctx).tls12_prf.output_block[0x2a] & 0xfc | 2;
            goto LAB_00111e7d;
          }
        }
      }
      else if (step == 0x203) {
        bVar3 = (operation->ctx).tls12_prf.output_block[0x2a];
        pVar5 = -0x89;
        if ((bVar3 & 4) == 0 && (~bVar3 & 3) != 0) {
          (operation->ctx).hkdf.info_length = data_length;
          if (data_length != 0) {
            __dest = (uint8_t *)calloc(1,data_length);
            (operation->ctx).hkdf.info = __dest;
            if (__dest == (uint8_t *)0x0) {
              pVar5 = -0x8d;
              goto LAB_00111d3b;
            }
            memcpy(__dest,data,data_length);
          }
          (operation->ctx).tls12_prf.output_block[0x2a] = bVar3 | 4;
          return 0;
        }
      }
      else if (((step == 0x202) &&
               (pVar5 = -0x89, ((operation->ctx).tls12_prf.output_block[0x2a] & 3) == 0)) &&
              (pVar5 = psa_hmac_setup_internal
                                 (&(operation->ctx).hkdf.hmac,data,data_length,hash_alg), pVar5 == 0
              )) {
        bVar3 = ((operation->ctx).tls12_prf.output_block[0x2a] & 0xfc) + 1;
LAB_00111e7d:
        (operation->ctx).tls12_prf.output_block[0x2a] = bVar3;
        return 0;
      }
      goto LAB_00111d3b;
    }
    uVar6 = uVar1 & 0xff | 0x1000000;
LAB_00111d26:
    pVar5 = psa_tls12_prf_input(&(operation->ctx).tls12_prf,uVar6,step,data,data_length);
  }
  if (pVar5 == 0) {
    return 0;
  }
LAB_00111d3b:
  psa_key_derivation_abort(operation);
  return pVar5;
}

Assistant:

static psa_status_t psa_key_derivation_input_internal(
    psa_key_derivation_operation_t *operation,
    psa_key_derivation_step_t step,
    psa_key_type_t key_type,
    const uint8_t *data,
    size_t data_length )
{
    psa_status_t status;
    psa_algorithm_t kdf_alg = psa_key_derivation_get_kdf_alg( operation );

    status = psa_key_derivation_check_input_type( step, key_type );
    if( status != PSA_SUCCESS )
        goto exit;

#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HKDF( kdf_alg ) )
    {
        status = psa_hkdf_input( &operation->ctx.hkdf,
                                 PSA_ALG_HKDF_GET_HASH( kdf_alg ),
                                 step, data, data_length );
    }
    else if( PSA_ALG_IS_TLS12_PRF( kdf_alg ) )
    {
        status = psa_tls12_prf_input( &operation->ctx.tls12_prf,
                                      PSA_ALG_HKDF_GET_HASH( kdf_alg ),
                                      step, data, data_length );
    }
    else if( PSA_ALG_IS_TLS12_PSK_TO_MS( kdf_alg ) )
    {
        status = psa_tls12_prf_psk_to_ms_input( &operation->ctx.tls12_prf,
                                                PSA_ALG_HKDF_GET_HASH( kdf_alg ),
                                                step, data, data_length );
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        /* This can't happen unless the operation object was not initialized */
        return( PSA_ERROR_BAD_STATE );
    }

exit:
    if( status != PSA_SUCCESS )
        psa_key_derivation_abort( operation );
    return( status );
}